

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ValueRelations.cpp
# Opt level: O1

HandlePtr __thiscall
dg::vr::ValueRelations::getAndMerge(ValueRelations *this,ValueRelations *other,Handle otherH)

{
  pointer ppVar1;
  _Base_ptr p_Var2;
  pair<unsigned_long,_std::reference_wrapper<const_dg::vr::Bucket>_> *pair;
  const_iterator cVar3;
  HandlePtr b;
  pointer ppVar4;
  size_t id;
  _Base_ptr p_Var5;
  key_type local_30;
  
  local_30._M_data = otherH;
  cVar3 = std::
          _Rb_tree<std::reference_wrapper<const_dg::vr::Bucket>,_std::pair<const_std::reference_wrapper<const_dg::vr::Bucket>,_dg::vr::VectorSet<const_llvm::Value_*>_>,_std::_Select1st<std::pair<const_std::reference_wrapper<const_dg::vr::Bucket>,_dg::vr::VectorSet<const_llvm::Value_*>_>_>,_std::less<std::reference_wrapper<const_dg::vr::Bucket>_>,_std::allocator<std::pair<const_std::reference_wrapper<const_dg::vr::Bucket>,_dg::vr::VectorSet<const_llvm::Value_*>_>_>_>
          ::find(&(other->bucketToVals)._M_t,&local_30);
  b = getCorresponding(this,other,otherH,
                       (VectorSet<const_llvm::Value_*> *)&cVar3._M_node[1]._M_parent);
  if (b == (HandlePtr)0x0) {
    b = (HandlePtr)0x0;
  }
  else {
    ppVar4 = (other->graph).borderBuckets.
             super__Vector_base<std::pair<unsigned_long,_std::reference_wrapper<const_dg::vr::Bucket>_>,_std::allocator<std::pair<unsigned_long,_std::reference_wrapper<const_dg::vr::Bucket>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    ppVar1 = (other->graph).borderBuckets.
             super__Vector_base<std::pair<unsigned_long,_std::reference_wrapper<const_dg::vr::Bucket>_>,_std::allocator<std::pair<unsigned_long,_std::reference_wrapper<const_dg::vr::Bucket>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    id = 0xffffffffffffffff;
    if (ppVar4 != ppVar1) {
      do {
        if (((ppVar4->second)._M_data)->id == otherH->id) {
          id = ppVar4->first;
          break;
        }
        ppVar4 = ppVar4 + 1;
      } while (ppVar4 != ppVar1);
    }
    if (id != 0xffffffffffffffff) {
      RelationsGraph<dg::vr::ValueRelations>::makeBorderBucket(&this->graph,b,id);
    }
    p_Var2 = cVar3._M_node[1]._M_left;
    for (p_Var5 = cVar3._M_node[1]._M_parent; p_Var5 != p_Var2;
        p_Var5 = (_Base_ptr)&p_Var5->_M_parent) {
      add(this,*(V *)p_Var5,b);
    }
  }
  return b;
}

Assistant:

ValueRelations::HandlePtr
ValueRelations::getAndMerge(const ValueRelations &other, Handle otherH) {
    const VectorSet<V> &otherEqual = other.getEqual(otherH);
    HandlePtr thisH = getCorresponding(other, otherH, otherEqual);

    if (!thisH)
        return nullptr;

    size_t borderId = other.getBorderId(otherH);
    if (borderId != std::string::npos)
        graph.makeBorderBucket(*thisH, borderId);

    for (V val : otherEqual)
        add(val, *thisH);

    return thisH;
}